

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O2

void Assimp::MD5::ConvertQuaternion(aiVector3D *in,aiQuaternion *out)

{
  float fVar1;
  float fVar2;
  
  out->x = in->x;
  out->y = in->y;
  fVar1 = in->z;
  out->z = fVar1;
  fVar1 = ((1.0 - in->x * in->x) - in->y * in->y) - fVar1 * fVar1;
  fVar2 = 0.0;
  if (0.0 <= fVar1) {
    if (fVar1 < 0.0) {
      fVar2 = sqrtf(fVar1);
    }
    else {
      fVar2 = SQRT(fVar1);
    }
  }
  out->w = -fVar2;
  return;
}

Assistant:

inline void ConvertQuaternion (const aiVector3D& in, aiQuaternion& out) {

    out.x = in.x;
    out.y = in.y;
    out.z = in.z;

    const float t = 1.0f - (in.x*in.x) - (in.y*in.y) - (in.z*in.z);

    if (t < 0.0f)
        out.w = 0.0f;
    else out.w = std::sqrt (t);

    // Assimp convention.
    out.w *= -1.f;
}